

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrint(char *string)

{
  byte bVar1;
  uint __c;
  char *pch;
  
  if (string != (char *)0x0) {
    for (; bVar1 = *string, bVar1 != 0; string = (char *)((byte *)string + 1)) {
      if ((byte)(bVar1 - 0x20) < 0x5f) {
        __c = (uint)bVar1;
LAB_00102c53:
        putchar(__c);
      }
      else {
        putchar(0x5c);
        if (bVar1 == 10) {
          __c = 0x6e;
          goto LAB_00102c53;
        }
        if (bVar1 == 0xd) {
          __c = 0x72;
          goto LAB_00102c53;
        }
        putchar(0x78);
        UnityPrintNumberHex((long)*string,'\x02');
      }
    }
  }
  return;
}

Assistant:

void UnityPrint(const char* string)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch)
        {
#ifdef UNITY_OUTPUT_COLOR
            /* print ANSI escape code */
            if ((*pch == 27) && (*(pch + 1) == '['))
            {
                pch += UnityPrintAnsiEscapeString(pch);
                continue;
            }
#endif
            UnityPrintChar(pch);
            pch++;
        }
    }
}